

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_util.h
# Opt level: O0

uint64_t pow2_ceil_u64(uint64_t x)

{
  long lVar1;
  size_t msb_on_index;
  uint64_t x_local;
  undefined8 local_8;
  
  local_8 = x;
  if (1 < x) {
    lVar1 = 0x3f;
    if (x - 1 != 0) {
      for (; x - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_8 = 1L << ((char)lVar1 + 1U & 0x3f);
  }
  return local_8;
}

Assistant:

BIT_UTIL_INLINE uint64_t
pow2_ceil_u64(uint64_t x) {
#if (defined(__amd64__) || defined(__x86_64__) || defined(JEMALLOC_HAVE_BUILTIN_CLZ))
	if(unlikely(x <= 1)) {
		return x;
	}
	size_t msb_on_index;
#if (defined(__amd64__) || defined(__x86_64__))
	asm ("bsrq %1, %0"
			: "=r"(msb_on_index) // Outputs.
			: "r"(x-1)           // Inputs.
		);
#elif (defined(JEMALLOC_HAVE_BUILTIN_CLZ))
	msb_on_index = (63 ^ __builtin_clzll(x - 1));
#endif
	assert(msb_on_index < 63);
	return 1ULL << (msb_on_index + 1);
#else
	x--;
	x |= x >> 1;
	x |= x >> 2;
	x |= x >> 4;
	x |= x >> 8;
	x |= x >> 16;
	x |= x >> 32;
	x++;
	return x;
#endif
}